

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O2

void __thiscall btQuantizedBvh::buildInternal(btQuantizedBvh *this)

{
  int iVar1;
  int iVar2;
  btBvhSubtreeInfo *this_00;
  btBvhSubtreeInfo local_38;
  
  this->m_useQuantization = true;
  iVar2 = (this->m_quantizedLeafNodes).m_size;
  local_38.m_quantizedAabbMin[0] = 0;
  local_38.m_quantizedAabbMin[1] = 0;
  local_38.m_quantizedAabbMin[2] = 0;
  local_38.m_quantizedAabbMax[0] = 0;
  local_38.m_quantizedAabbMax[1] = 0;
  local_38.m_quantizedAabbMax[2] = 0;
  local_38.m_rootNodeIndex = 0;
  btAlignedObjectArray<btQuantizedBvhNode>::resize
            (&this->m_quantizedContiguousNodes,iVar2 * 2,(btQuantizedBvhNode *)&local_38);
  this->m_curNodeIndex = 0;
  buildTree(this,0,iVar2);
  iVar2 = (this->m_SubtreeHeaders).m_size;
  if ((iVar2 == 0 & this->m_useQuantization) == 1) {
    this_00 = btAlignedObjectArray<btBvhSubtreeInfo>::expand(&this->m_SubtreeHeaders,&local_38);
    btBvhSubtreeInfo::setAabbFromQuantizeNode(this_00,(this->m_quantizedContiguousNodes).m_data);
    this_00->m_rootNodeIndex = 0;
    iVar2 = ((this->m_quantizedContiguousNodes).m_data)->m_escapeIndexOrTriangleIndex;
    iVar1 = 1;
    if (iVar2 < 0) {
      iVar1 = -iVar2;
    }
    this_00->m_subtreeSize = iVar1;
    iVar2 = (this->m_SubtreeHeaders).m_size;
  }
  this->m_subtreeHeaderCount = iVar2;
  btAlignedObjectArray<btQuantizedBvhNode>::clear(&this->m_quantizedLeafNodes);
  btAlignedObjectArray<btOptimizedBvhNode>::clear(&this->m_leafNodes);
  return;
}

Assistant:

void btQuantizedBvh::buildInternal()
{
	///assumes that caller filled in the m_quantizedLeafNodes
	m_useQuantization = true;
	int numLeafNodes = 0;
	
	if (m_useQuantization)
	{
		//now we have an array of leafnodes in m_leafNodes
		numLeafNodes = m_quantizedLeafNodes.size();

		m_quantizedContiguousNodes.resize(2*numLeafNodes);

	}

	m_curNodeIndex = 0;

	buildTree(0,numLeafNodes);

	///if the entire tree is small then subtree size, we need to create a header info for the tree
	if(m_useQuantization && !m_SubtreeHeaders.size())
	{
		btBvhSubtreeInfo& subtree = m_SubtreeHeaders.expand();
		subtree.setAabbFromQuantizeNode(m_quantizedContiguousNodes[0]);
		subtree.m_rootNodeIndex = 0;
		subtree.m_subtreeSize = m_quantizedContiguousNodes[0].isLeafNode() ? 1 : m_quantizedContiguousNodes[0].getEscapeIndex();
	}

	//PCK: update the copy of the size
	m_subtreeHeaderCount = m_SubtreeHeaders.size();

	//PCK: clear m_quantizedLeafNodes and m_leafNodes, they are temporary
	m_quantizedLeafNodes.clear();
	m_leafNodes.clear();
}